

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_election_timeout(raft_server *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  srv_role sVar6;
  int32 iVar7;
  srv_role sVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  __int_type _Var12;
  undefined8 *puVar13;
  uint64_t uVar14;
  element_type *peVar15;
  element_type *peVar16;
  element_type *this_00;
  undefined8 uVar17;
  size_type sVar18;
  long in_RDI;
  raft_server *in_stack_00000070;
  ulong state_term;
  ulong last_log_term;
  int time_ms;
  unique_lock<std::recursive_mutex> guard;
  memory_order __b;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined1 uVar19;
  char *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  context *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  raft_server *in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc78;
  timer_helper *in_stack_fffffffffffffc80;
  ulong uVar20;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  uint uVar21;
  bool local_341;
  raft_server *in_stack_fffffffffffffd00;
  raft_server *in_stack_fffffffffffffd98;
  string local_248 [32];
  string local_228 [32];
  ulong local_208;
  undefined1 local_200 [23];
  byte local_1e9;
  __shared_ptr local_1e8 [16];
  ulong local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [39];
  byte local_169;
  int local_154;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [36];
  undefined4 local_ac;
  string local_a8 [64];
  string local_68 [40];
  long local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_28;
  long *local_20;
  undefined8 local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  sVar8 = (srv_role)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar3) {
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1fbbb8);
    iVar5 = (*peVar9->_vptr_logger[7])();
    if (5 < iVar5) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fbbde);
      msg_if_given_abi_cxx11_((char *)local_68,"election timeout");
      (*peVar9->_vptr_logger[8])
                (peVar9,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"handle_election_timeout",0xc9,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc40,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
  if (bVar3) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fbcd7);
      iVar5 = (*peVar9->_vptr_logger[7])();
      if (2 < iVar5) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbd10);
        msg_if_given_abi_cxx11_
                  ((char *)local_a8,"Triggered election timer but server is shutting down");
        (*peVar9->_vptr_logger[8])
                  (peVar9,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_election_timeout",0xcc,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
    }
    local_ac = 1;
  }
  else if (*(int *)(in_RDI + 0x14c) < 1) {
    bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
    if (bVar3) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fc0e8);
        iVar5 = (*peVar9->_vptr_logger[7])();
        if (3 < iVar5) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fc121);
          msg_if_given_abi_cxx11_
                    ((char *)local_110,"election timeout while joining the cluster, ignore it.");
          (*peVar9->_vptr_logger[8])
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xf7,local_110);
          std::__cxx11::string::~string(local_110);
        }
      }
      restart_election_timer(in_stack_fffffffffffffd00);
      local_ac = 1;
    }
    else {
      bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
      if (bVar3) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fc217);
          iVar5 = (*peVar9->_vptr_logger[7])();
          if (2 < iVar5) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1fc250);
            msg_if_given_abi_cxx11_
                      ((char *)local_130,"Triggered election timer but server is out of log range");
            (*peVar9->_vptr_logger[8])
                      (peVar9,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_election_timeout",0xfd,local_130);
            std::__cxx11::string::~string(local_130);
          }
        }
        local_ac = 1;
      }
      else {
        bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
        if ((bVar3) &&
           (_Var12 = std::__atomic_base::operator_cast_to_unsigned_long
                               ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc48),
           _Var12 < 0x14)) {
          local_20 = (long *)(in_RDI + 0x308);
          local_28 = 1;
          local_2c = 5;
          local_38 = 1;
          LOCK();
          local_40 = *local_20;
          *local_20 = *local_20 + 1;
          UNLOCK();
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar3) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1fc46b);
            iVar5 = (*peVar9->_vptr_logger[7])();
            if (2 < iVar5) {
              in_stack_fffffffffffffd00 =
                   (raft_server *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fc4a4);
              puVar13 = (undefined8 *)(in_RDI + 0x308);
              local_c = 5;
              local_8 = puVar13;
              local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              if (local_c - 1U < 2) {
                local_18 = *puVar13;
              }
              else if (local_c == 5) {
                local_18 = *puVar13;
              }
              else {
                local_18 = *puVar13;
              }
              msg_if_given_abi_cxx11_
                        ((char *)local_150,
                         "election timeout while receiving snapshot, count %lu, ignore it.",local_18
                        );
              (*in_stack_fffffffffffffd00->_vptr_raft_server[8])
                        (in_stack_fffffffffffffd00,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_election_timeout",0x106,local_150);
              std::__cxx11::string::~string(local_150);
            }
          }
          restart_election_timer(in_stack_fffffffffffffd00);
          local_ac = 1;
        }
        else {
          uVar14 = timer_helper::get_us(in_stack_fffffffffffffc80);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar14;
          local_154 = SUB164(auVar1 / ZEXT816(1000),0);
          bVar4 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
          iVar5 = local_154;
          local_169 = 0;
          bVar3 = true;
          if (!bVar4) {
            std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                      ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                       0x1fc687);
            nuraft::context::get_params(in_stack_fffffffffffffc58);
            local_169 = 1;
            peVar15 = std::
                      __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1fc6ae);
            bVar3 = iVar5 < peVar15->election_timeout_lower_bound_;
          }
          if ((local_169 & 1) != 0) {
            std::shared_ptr<nuraft::raft_params>::~shared_ptr
                      ((shared_ptr<nuraft::raft_params> *)0x1fc6ec);
          }
          if (bVar3) {
            bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
            if (bVar3) {
              peVar9 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1fc72d);
              iVar5 = (*peVar9->_vptr_logger[7])();
              if (3 < iVar5) {
                peVar9 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1fc766);
                msg_if_given_abi_cxx11_
                          ((char *)local_190,
                           "election timeout while serving append entries, ignore it.");
                (*peVar9->_vptr_logger[8])
                          (peVar9,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_election_timeout",0x111,local_190);
                std::__cxx11::string::~string(local_190);
              }
            }
            restart_election_timer(in_stack_fffffffffffffd00);
            local_ac = 1;
          }
          else {
            sVar6 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1fc822);
            if (sVar6 == leader) {
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
              if (bVar3) {
                peVar9 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1fc85c);
                iVar5 = (*peVar9->_vptr_logger[7])();
                if (1 < iVar5) {
                  peVar9 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1fc895);
                  msg_if_given_abi_cxx11_
                            ((char *)local_1b0,
                             "A leader should never encounter election timeout, illegal application state, ignore it."
                            );
                  (*peVar9->_vptr_logger[8])
                            (peVar9,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                             ,"handle_election_timeout",0x118,local_1b0);
                  std::__cxx11::string::~string(local_1b0);
                }
              }
              local_ac = 1;
            }
            else {
              if ((*(byte *)(in_RDI + 0x148) & 1) == 0) {
                bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
                if (bVar3) {
                  peVar9 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1fc974);
                  iVar5 = (*peVar9->_vptr_logger[7])();
                  if (2 < iVar5) {
                    peVar9 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x1fc9ad);
                    msg_if_given_abi_cxx11_
                              ((char *)local_1d0,"Election timeout, initiate leader election");
                    (*peVar9->_vptr_logger[8])
                              (peVar9,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                               ,"handle_election_timeout",0x11e,local_1d0);
                    std::__cxx11::string::~string(local_1d0);
                  }
                }
                bVar3 = std::atomic::operator_cast_to_bool
                                  ((atomic<bool> *)in_stack_fffffffffffffc48);
                if (!bVar3) {
                  decay_target_priority
                            ((raft_server *)
                             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
                }
                local_1d8 = 0;
                bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2e0));
                local_1e9 = 0;
                local_341 = false;
                if (bVar3) {
                  peVar16 = std::
                            __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1fcaad);
                  (*peVar16->_vptr_log_store[4])(local_1e8);
                  local_1e9 = 1;
                  local_341 = std::__shared_ptr::operator_cast_to_bool(local_1e8);
                }
                if ((local_1e9 & 1) != 0) {
                  std::shared_ptr<nuraft::log_entry>::~shared_ptr
                            ((shared_ptr<nuraft::log_entry> *)0x1fcb06);
                }
                if (local_341 != false) {
                  peVar16 = std::
                            __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1fcb2a);
                  (*peVar16->_vptr_log_store[4])(local_200);
                  this_00 = std::
                            __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1fcb4d);
                  local_1d8 = log_entry::get_term(this_00);
                  std::shared_ptr<nuraft::log_entry>::~shared_ptr
                            ((shared_ptr<nuraft::log_entry> *)0x1fcb76);
                }
                std::
                __shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1fcbb2);
                local_208 = srv_state::get_term((srv_state *)0x1fcbba);
                bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
                if (bVar3) {
                  peVar9 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1fcbff);
                  iVar5 = (*peVar9->_vptr_logger[7])();
                  if (3 < iVar5) {
                    peVar9 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x1fcc32);
                    std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1fcc4b);
                    srv_role_to_string_abi_cxx11_(sVar8);
                    uVar17 = std::__cxx11::string::c_str();
                    uVar2 = local_208;
                    in_stack_fffffffffffffc38 = *(undefined4 *)(in_RDI + 0x3c);
                    uVar21 = *(uint *)(in_RDI + 0x40);
                    uVar20 = local_1d8;
                    bVar3 = std::atomic::operator_cast_to_bool
                                      ((atomic<bool> *)in_stack_fffffffffffffc48);
                    in_stack_fffffffffffffc40 = "hb dead";
                    if (bVar3) {
                      in_stack_fffffffffffffc40 = "hb alive";
                    }
                    bVar3 = std::atomic::operator_cast_to_bool
                                      ((atomic<bool> *)in_stack_fffffffffffffc48);
                    in_stack_fffffffffffffc48 = "pre-vote NOT done";
                    if (bVar3) {
                      in_stack_fffffffffffffc48 = "pre-vote done";
                    }
                    in_stack_fffffffffffffc68 = (raft_server *)in_stack_fffffffffffffc40;
                    msg_if_given_abi_cxx11_
                              ((char *)local_228,
                               "[ELECTION TIMEOUT] current role: %s, log last term %lu, state term %lu, target p %d, my p %d, %s, %s"
                               ,uVar17,uVar20,uVar2,(ulong)uVar21);
                    (*peVar9->_vptr_logger[8])
                              (peVar9,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                               ,"handle_election_timeout",0x130,local_228);
                    std::__cxx11::string::~string(local_228);
                    std::__cxx11::string::~string(local_248);
                  }
                }
                if (*(ulong *)(in_RDI + 200) != local_208) {
                  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318))
                  ;
                  if (bVar3) {
                    peVar9 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x1fce17);
                    iVar5 = (*peVar9->_vptr_logger[7])();
                    if (3 < iVar5) {
                      peVar9 = std::
                               __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x1fce4a);
                      msg_if_given_abi_cxx11_
                                (&stack0xfffffffffffffd98,
                                 "pre-vote term (%lu) is different, reset it to %lu",
                                 *(undefined8 *)(in_RDI + 200),local_208);
                      (*peVar9->_vptr_logger[8])
                                (peVar9,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                                 ,"handle_election_timeout",0x135,&stack0xfffffffffffffd98);
                      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
                    }
                  }
                  pre_vote_status_t::reset
                            ((pre_vote_status_t *)in_stack_fffffffffffffc40,
                             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
                }
                uVar19 = (undefined1)((ulong)in_RDI >> 0x38);
                sVar18 = std::
                         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                         ::size((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                                 *)0x1fcf1b);
                if (((sVar18 == 0) ||
                    (bVar3 = std::atomic::operator_cast_to_bool
                                       ((atomic<bool> *)in_stack_fffffffffffffc48), bVar3)) ||
                   (iVar7 = get_quorum_for_election(in_stack_fffffffffffffc68), iVar7 == 0)) {
                  initiate_vote(in_stack_fffffffffffffd98,(bool)uVar19);
                }
                else {
                  request_prevote(in_stack_00000070);
                }
              }
              sVar8 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1fcf93);
              if (sVar8 != leader) {
                restart_election_timer(in_stack_fffffffffffffd00);
              }
              local_ac = 0;
            }
          }
        }
      }
    }
  }
  else {
    iVar5 = *(int *)(in_RDI + 0x14c) + -1;
    *(int *)(in_RDI + 0x14c) = iVar5;
    if (iVar5 == 0) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      uVar19 = (undefined1)((uint)in_stack_fffffffffffffc3c >> 0x18);
      if (bVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbe28);
        iVar5 = (*peVar9->_vptr_logger[7])();
        if (3 < iVar5) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbe61);
          msg_if_given_abi_cxx11_
                    ((char *)local_d0,
                     "no hearing further news from leader, remove this server from cluster and step down"
                    );
          (*peVar9->_vptr_logger[8])
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xd3,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
      }
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1fbefe);
      srv_state::allow_election_timer((srv_state *)in_stack_fffffffffffffc40,(bool)uVar19);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1fbf1e);
      peVar10 = std::
                __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1fbf26);
      peVar11 = std::
                __shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffc40);
      (*peVar10->_vptr_state_mgr[4])(peVar10,peVar11);
      cancel_schedulers((raft_server *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                       );
      local_ac = 1;
    }
    else {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbfa8);
        iVar5 = (*peVar9->_vptr_logger[7])();
        if (3 < iVar5) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbfe1);
          msg_if_given_abi_cxx11_
                    ((char *)local_f0,
                     "stepping down (cycles left: %d), skip this election timeout event",
                     (ulong)*(uint *)(in_RDI + 0x14c));
          (*peVar9->_vptr_logger[8])
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xef,local_f0);
          std::__cxx11::string::~string(local_f0);
        }
      }
      restart_election_timer(in_stack_fffffffffffffd00);
      local_ac = 1;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc40);
  return;
}

Assistant:

void raft_server::handle_election_timeout() {
    p_tr("election timeout");
    recur_lock(lock_);
    if (stopping_) {
        p_wn("Triggered election timer but server is shutting down");
        return;
    }

    if (steps_to_down_ > 0) {
        if (--steps_to_down_ == 0) {
            p_in("no hearing further news from leader, "
                 "remove this server from cluster and step down");
            // Modified by Jung-Sang Ahn (Oct 25, 2017):
            // Should maintain the info of itself in the config,
            // for the next launch.
            /*
            for ( std::list<ptr<srv_config>>::iterator it =
                      config_->get_servers().begin();
                  it != config_->get_servers().end();
                  ++it ) {
                if ((*it)->get_id() == id_) {
                    config_->get_servers().erase(it);
                    ctx_->state_mgr_->save_config(*config_);
                    break;
                }
            }
            */
            state_->allow_election_timer(false);
            ctx_->state_mgr_->save_state(*state_);

            // Modified by Jung-Sang Ahn (Dec 24, 2019):
            // Same as in reconfigure().
            //reset_peer_info();
            cancel_schedulers();
            return;
        }

        p_in( "stepping down (cycles left: %d), "
              "skip this election timeout event",
              steps_to_down_ );
        restart_election_timer();
        return;
    }

    if (catching_up_) {
        // this is a new server for the cluster, will not send out vote req
        // until conf that includes this srv is committed
        p_in("election timeout while joining the cluster, ignore it.");
        restart_election_timer();
        return;
    }

    if (out_of_log_range_) {
        p_wn("Triggered election timer but server is out of log range");
        return;
    }

    if (receiving_snapshot_ && et_cnt_receiving_snapshot_ < 20) {
        // If this node is receiving snapshot,
        // ignore election timeout 20 times.
        et_cnt_receiving_snapshot_.fetch_add(1);
        p_wn("election timeout while receiving snapshot, count %" PRIu64 ", "
             "ignore it.", et_cnt_receiving_snapshot_.load());
        restart_election_timer();
        return;
    }

    int time_ms = last_election_timer_reset_.get_us() / 1000;
    if ( serving_req_ ||
         time_ms < ctx_->get_params()->election_timeout_lower_bound_ ) {
        // Handling appending entries is now taking long time,
        // so that server keeps skipping sending heartbeat.
        // It doesn't mean server is gone. Just ignore.
        p_in("election timeout while serving append entries, ignore it.");
        restart_election_timer();
        return;
    }

    if (role_ == srv_role::leader) {
        p_er( "A leader should never encounter election timeout, "
              "illegal application state, ignore it.");
        return;
    }

    // Only voting member can suggest vote.
    if (!im_learner_) {
        p_wn("Election timeout, initiate leader election");
        if (!hb_alive_) {
            // Not the first election timeout, decay the target priority.
            decay_target_priority();
        }

        ulong last_log_term = 0;
        if (log_store_ && log_store_->last_entry()) {
            last_log_term = log_store_->last_entry()->get_term();
        }

        ulong state_term = state_->get_term();

        p_in( "[ELECTION TIMEOUT] current role: %s, log last term %" PRIu64 ", "
              "state term %" PRIu64 ", target p %d, my p %d, %s, %s",
              srv_role_to_string(role_).c_str(), last_log_term, state_term,
              target_priority_, my_priority_,
              (hb_alive_) ? "hb alive" : "hb dead",
              (pre_vote_.done_) ? "pre-vote done" : "pre-vote NOT done");

        // `term` changed, cannot use previous pre-vote result.
        if (pre_vote_.term_ != state_term) {
            p_in("pre-vote term (%" PRIu64 ") is different, reset it to %" PRIu64 "",
                 pre_vote_.term_, state_term);
            pre_vote_.reset(state_term);
        }

        if ( !peers_.size() ||
             pre_vote_.done_ ||
             get_quorum_for_election() == 0 ) {
            initiate_vote();
        } else {
            request_prevote();
        }

    }

    // restart the election timer if this is not yet a leader
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }
}